

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathObjectPtr xmlXPathConvertString(xmlXPathObjectPtr val)

{
  xmlChar *val_00;
  xmlXPathObjectPtr pxVar1;
  
  if (val != (xmlXPathObjectPtr)0x0) {
    val_00 = (xmlChar *)0x0;
    switch(val->type) {
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      val_00 = xmlXPathCastNodeSetToString(val->nodesetval);
      break;
    case XPATH_BOOLEAN:
      val_00 = xmlXPathCastBooleanToString(val->boolval);
      break;
    case XPATH_NUMBER:
      val_00 = xmlXPathCastNumberToString(val->floatval);
      break;
    case XPATH_STRING:
      return val;
    }
    xmlXPathFreeObject(val);
    if (val_00 != (xmlChar *)0x0) {
      pxVar1 = xmlXPathWrapString(val_00);
      return pxVar1;
    }
  }
  pxVar1 = xmlXPathNewString("");
  return pxVar1;
}

Assistant:

xmlXPathObjectPtr
xmlXPathConvertString(xmlXPathObjectPtr val) {
    xmlChar *res = NULL;

    if (val == NULL)
	return(xmlXPathNewCString(""));

    switch (val->type) {
    case XPATH_UNDEFINED:
	break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
	res = xmlXPathCastNodeSetToString(val->nodesetval);
	break;
    case XPATH_STRING:
	return(val);
    case XPATH_BOOLEAN:
	res = xmlXPathCastBooleanToString(val->boolval);
	break;
    case XPATH_NUMBER:
	res = xmlXPathCastNumberToString(val->floatval);
	break;
    case XPATH_USERS:
	/* TODO */
	break;
    }
    xmlXPathFreeObject(val);
    if (res == NULL)
	return(xmlXPathNewCString(""));
    return(xmlXPathWrapString(res));
}